

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

run_container_t * run_container_create_given_capacity(int32_t size)

{
  run_container_t *prVar1;
  rle16_t *prVar2;
  
  prVar1 = (run_container_t *)(*global_memory_hook.malloc)(0x10);
  if (prVar1 == (run_container_t *)0x0) {
LAB_00111832:
    prVar1 = (run_container_t *)0x0;
  }
  else {
    if (size < 1) {
      prVar1->runs = (rle16_t *)0x0;
    }
    else {
      prVar2 = (rle16_t *)(*global_memory_hook.malloc)((ulong)(uint)size << 2);
      prVar1->runs = prVar2;
      if (prVar2 == (rle16_t *)0x0) {
        (*global_memory_hook.free)(prVar1);
        goto LAB_00111832;
      }
    }
    prVar1->capacity = size;
    prVar1->n_runs = 0;
  }
  return prVar1;
}

Assistant:

run_container_t *run_container_create_given_capacity(int32_t size) {
    run_container_t *run;
    /* Allocate the run container itself. */
    if ((run = (run_container_t *)roaring_malloc(sizeof(run_container_t))) ==
        NULL) {
        return NULL;
    }
    if (size <= 0) {  // we don't want to rely on malloc(0)
        run->runs = NULL;
    } else if ((run->runs = (rle16_t *)roaring_malloc(sizeof(rle16_t) *
                                                      size)) == NULL) {
        roaring_free(run);
        return NULL;
    }
    run->capacity = size;
    run->n_runs = 0;
    return run;
}